

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

_Bool arm_s1_regime_using_lpae_format_aarch64(CPUARMState_conflict *env,ARMMMUIdx mmu_idx)

{
  _Bool _Var1;
  _Bool _Var2;
  uint32_t el;
  TCR *pTVar3;
  ARMMMUIdx mmu_idx_00;
  
  if (mmu_idx == ARMMMUIdx_E10_0) {
    mmu_idx_00 = ARMMMUIdx_Stage1_E0;
  }
  else if (mmu_idx == ARMMMUIdx_E10_1_PAN) {
    mmu_idx_00 = ARMMMUIdx_Stage1_E1_PAN;
  }
  else {
    if (mmu_idx != ARMMMUIdx_E10_1) {
      el = regime_el(env,mmu_idx);
      _Var1 = true;
      if ((el != 2) && (_Var2 = arm_el_is_aa64(env,el), !_Var2)) {
        if (((env->features & 0x4000000) != 0) &&
           (pTVar3 = regime_tcr(env,mmu_idx), (pTVar3->raw_tcr & 0x80000000) != 0)) {
          return true;
        }
        _Var1 = false;
      }
      return _Var1;
    }
    mmu_idx_00 = ARMMMUIdx_Stage1_E1;
  }
  _Var1 = regime_using_lpae_format(env,mmu_idx_00);
  return _Var1;
}

Assistant:

static inline ARMMMUIdx stage_1_mmu_idx(ARMMMUIdx mmu_idx)
{
    switch (mmu_idx) {
    case ARMMMUIdx_E10_0:
        return ARMMMUIdx_Stage1_E0;
    case ARMMMUIdx_E10_1:
        return ARMMMUIdx_Stage1_E1;
    case ARMMMUIdx_E10_1_PAN:
        return ARMMMUIdx_Stage1_E1_PAN;
    default:
        return mmu_idx;
    }
}